

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O2

void __thiscall
testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
          (HasNewFatalFailureHelper *this)

{
  long lVar1;
  UnitTestImpl *pUVar2;
  TestPartResultReporterInterface *pTVar3;
  TestPartResultReporterInterface **ppTVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_TestPartResultReporterInterface)._vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__HasNewFatalFailureHelper_00184678;
  this->has_new_fatal_failure_ = false;
  pUVar2 = GetUnitTestImpl();
  pTVar3 = UnitTestImpl::GetTestPartResultReporterForCurrentThread(pUVar2);
  this->original_reporter_ = pTVar3;
  pUVar2 = GetUnitTestImpl();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ppTVar4 = ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                        (&pUVar2->per_thread_test_part_result_reporter_);
    *ppTVar4 = &this->super_TestPartResultReporterInterface;
    return;
  }
  __stack_chk_fail();
}

Assistant:

HasNewFatalFailureHelper::HasNewFatalFailureHelper()
    : has_new_fatal_failure_(false),
      original_reporter_(GetUnitTestImpl()->
                         GetTestPartResultReporterForCurrentThread()) {
  GetUnitTestImpl()->SetTestPartResultReporterForCurrentThread(this);
}